

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator * __thiscall
QMultiHash<int,_int>::erase
          (iterator *__return_storage_ptr__,QMultiHash<int,_int> *this,const_iterator it)

{
  byte bVar1;
  Chain *pCVar2;
  MultiNodeChain<int> *pMVar3;
  Span *pSVar4;
  Chain **ppCVar5;
  Data *pDVar6;
  ulong uVar7;
  undefined1 *puVar8;
  long lVar9;
  undefined1 *puVar10;
  uchar *puVar11;
  Span *pSVar12;
  uint uVar13;
  long in_FS_OFFSET;
  Bucket bucket;
  iterator local_48;
  long local_30;
  ulong uVar14;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.e = (Chain **)&DAT_aaaaaaaaaaaaaaaa;
  local_48.i.d = (Data<QHashPrivate::MultiNode<int,_int>_> *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  detach(&local_48,this,it);
  ppCVar5 = local_48.e;
  __return_storage_ptr__->e = local_48.e;
  (__return_storage_ptr__->i).d = local_48.i.d;
  (__return_storage_ptr__->i).bucket = local_48.i.bucket;
  pCVar2 = *local_48.e;
  pMVar3 = pCVar2->next;
  *local_48.e = pMVar3;
  operator_delete(pCVar2,0x10);
  if (pMVar3 != (MultiNodeChain<int> *)0x0) goto LAB_004cae7f;
  uVar14 = (__return_storage_ptr__->i).bucket;
  pSVar4 = ((__return_storage_ptr__->i).d)->spans;
  uVar7 = uVar14 >> 7;
  pSVar12 = pSVar4 + uVar7;
  uVar13 = (uint)uVar14 & 0x7f;
  uVar14 = (ulong)uVar13;
  if (ppCVar5 == (Chain **)(pSVar4[uVar7].entries[pSVar12->offsets[uVar14]].storage.data + 8)) {
    bucket.index._0_4_ = uVar13;
    bucket.span = pSVar12;
    bucket.index._4_4_ = 0;
    QHashPrivate::Data<QHashPrivate::MultiNode<int,_int>_>::erase(this->d,bucket);
    pDVar6 = this->d;
    pSVar4 = pDVar6->spans;
    lVar9 = (long)pSVar12 - (long)pSVar4 >> 4;
    puVar8 = (undefined1 *)(lVar9 * 0x1c71c71c71c71c80 | uVar14);
    if ((puVar8 != (undefined1 *)(pDVar6->numBuckets - 1)) && (pSVar12->offsets[uVar14] != 0xff)) {
      uVar7 = lVar9 * -0x71c71c71c71c71c7 & 0x1ffffffffffffff;
      puVar11 = pSVar4[uVar7].entries[pSVar4[uVar7].offsets[uVar14]].storage.data + 8;
      goto LAB_004cae74;
    }
    puVar10 = (undefined1 *)local_48.i.bucket;
    do {
      puVar8 = puVar10 + 1;
      local_48.i.bucket = (size_t)puVar8;
      if ((undefined1 *)((local_48.i.d)->numBuckets - 1) == puVar10) goto LAB_004cae70;
      pSVar12 = (local_48.i.d)->spans + ((ulong)puVar8 >> 7);
      bVar1 = pSVar12->offsets[(uint)puVar8 & 0x7f];
      puVar10 = puVar8;
    } while (bVar1 == 0xff);
  }
  else {
    puVar10 = (undefined1 *)local_48.i.bucket;
    do {
      puVar8 = puVar10 + 1;
      local_48.i.bucket = (size_t)puVar8;
      if ((undefined1 *)((local_48.i.d)->numBuckets - 1) == puVar10) goto LAB_004cae70;
      pSVar12 = (local_48.i.d)->spans + ((ulong)puVar8 >> 7);
      bVar1 = pSVar12->offsets[(uint)puVar8 & 0x7f];
      puVar10 = puVar8;
    } while (bVar1 == 0xff);
  }
  puVar11 = pSVar12->entries[bVar1].storage.data + 8;
  pDVar6 = local_48.i.d;
  local_48.i.bucket = (size_t)puVar8;
  goto LAB_004cae74;
LAB_004cae70:
  puVar11 = (uchar *)0x0;
  pDVar6 = (Data *)0x0;
  puVar8 = (undefined1 *)0x0;
LAB_004cae74:
  (__return_storage_ptr__->i).d = pDVar6;
  (__return_storage_ptr__->i).bucket = (size_t)puVar8;
  __return_storage_ptr__->e = (Chain **)puVar11;
LAB_004cae7f:
  this->m_size = this->m_size + -1;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

iterator erase(const_iterator it)
    {
        Q_ASSERT(d);
        iterator iter = detach(it);
        iterator i = iter;
        Chain *e = *i.e;
        Chain *next = e->next;
        *i.e = next;
        delete e;
        if (!next) {
            if (i.e == &i.i.node()->value) {
                // last remaining entry, erase
                typename Data::Bucket bucket(i.i);
                d->erase(bucket);
                if (bucket.toBucketIndex(d) == d->numBuckets - 1 || bucket.isUnused())
                    i = iterator(++iter.i);
                else // 'i' currently has a nullptr chain. So, we must recreate it
                    i = iterator(bucket.toIterator(d));
            } else {
                i = iterator(++iter.i);
            }
        }
        --m_size;
        Q_ASSERT(m_size >= 0);
        return i;
    }